

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*in_R8) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (anonymous_namespace)::CWriter::
  Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((CWriter *)this,&(decl->sig).result_types,(char (*) [2])name,in_RCX,in_R8);
  std::operator+(&local_38,"w2c_",&this->module_prefix_);
  WriteData(this,local_38._M_dataplus._M_p,local_38._M_string_length);
  WriteData(this,"*",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  WriteParamTypes(this,decl);
  WriteData(this,")",1);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(decl.sig.result_types, " ", name, "(");
  Write(ModuleInstanceTypeName(), "*");
  WriteParamTypes(decl);
  Write(")");
}